

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O0

int get_line_thickness(Am_Object *obj)

{
  Am_Value *in_value;
  Am_Wrapper *pAVar1;
  int local_4c;
  short local_32;
  Am_Line_Cap_Style_Flag local_30;
  short thickness;
  Am_Line_Cap_Style_Flag cap;
  Am_Style local_20;
  Am_Style ls;
  Am_Object *obj_local;
  
  ls.data = (Am_Style_Data *)obj;
  in_value = Am_Object::Get(obj,0x6b,0);
  Am_Style::Am_Style(&local_20,in_value);
  pAVar1 = Am_Style::operator_cast_to_Am_Wrapper_(&local_20);
  if (pAVar1 == (Am_Wrapper *)0x0) {
    obj_local._4_4_ = 0;
  }
  else {
    Am_Style::Get_Line_Thickness_Values(&local_20,&local_32,&local_30);
    if (local_32 == 0) {
      local_4c = 1;
    }
    else {
      local_4c = (int)local_32;
    }
    obj_local._4_4_ = local_4c;
  }
  Am_Style::~Am_Style(&local_20);
  return obj_local._4_4_;
}

Assistant:

int
get_line_thickness(Am_Object obj)
{
  Am_Style ls = obj.Get(Am_LINE_STYLE);
  if (ls) {
    Am_Line_Cap_Style_Flag cap;
    short thickness;
    ls.Get_Line_Thickness_Values(thickness, cap);
    return thickness ? thickness : 1;
  } else
    return 0; // no thickness because no line_style
}